

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildMaybeSignal(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  string *input;
  ostream *poVar2;
  string local_40;
  
  if (value->type_ == 3) {
    input = picojson::value::get<std::__cxx11::string>(value);
    string_trim(&local_40,input);
    bVar1 = buildSignal(this,&local_40,clazz);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: signal in class=\'");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2,"\' is not a JSON string..");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ObjectModelBuilder::buildMaybeSignal(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: signal in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildSignal(string_trim(value.get<std::string>()), clazz);
}